

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_redaction.pb.cc
# Opt level: O1

size_t __thiscall proto2_unittest::TestMessageEnum::ByteSizeLong(TestMessageEnum *this)

{
  uint uVar1;
  size_t sVar2;
  
  sVar2 = google::protobuf::internal::WireFormatLite::EnumSize
                    (&(this->field_0)._impl_.redactable_enum_);
  uVar1 = google::protobuf::internal::SooRep::size
                    ((SooRep *)&(this->field_0)._impl_,
                     (undefined1  [24])((undefined1  [24])this->field_0 & (undefined1  [24])0x4) ==
                     (undefined1  [24])0x0);
  sVar2 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,uVar1 + sVar2,&(this->field_0)._impl_._cached_size_);
  return sVar2;
}

Assistant:

::size_t TestMessageEnum::ByteSizeLong() const {
  const TestMessageEnum& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestMessageEnum)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .proto2_unittest.MetaAnnotatedEnum redactable_enum = 1;
    {
      ::size_t data_size =
          ::_pbi::WireFormatLite::EnumSize(this_._internal_redactable_enum());
      ::size_t tag_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_redactable_enum_size());
      total_size += data_size + tag_size;
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}